

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::syntax::SyntaxNode_const*>::
emplaceRealloc<slang::syntax::SyntaxNode_const*>
          (SmallVectorBase<slang::syntax::SyntaxNode_const*> *this,pointer pos,SyntaxNode **args)

{
  size_type sVar1;
  size_type sVar2;
  size_type capacity;
  iterator ppSVar3;
  SyntaxNode **__result;
  SyntaxNode **ppSVar4;
  EVP_PKEY_CTX *ctx;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  SyntaxNode **args_local;
  pointer pos_local;
  SmallVectorBase<const_slang::syntax::SyntaxNode_*> *this_local;
  
  sVar1 = *(size_type *)(this + 8);
  sVar2 = SmallVectorBase<const_slang::syntax::SyntaxNode_*>::max_size
                    ((SmallVectorBase<const_slang::syntax::SyntaxNode_*> *)this);
  if (sVar1 == sVar2) {
    slang::detail::throwLengthError();
  }
  capacity = SmallVectorBase<const_slang::syntax::SyntaxNode_*>::calculateGrowth
                       ((SmallVectorBase<const_slang::syntax::SyntaxNode_*> *)this,
                        *(long *)(this + 8) + 1);
  ppSVar3 = SmallVectorBase<const_slang::syntax::SyntaxNode_*>::begin
                      ((SmallVectorBase<const_slang::syntax::SyntaxNode_*> *)this);
  __result = (SyntaxNode **)slang::detail::allocArray(capacity,8);
  ppSVar4 = __result + ((long)pos - (long)ppSVar3 >> 3);
  *ppSVar4 = *args;
  ppSVar3 = SmallVectorBase<const_slang::syntax::SyntaxNode_*>::end
                      ((SmallVectorBase<const_slang::syntax::SyntaxNode_*> *)this);
  if (pos == ppSVar3) {
    ppSVar3 = SmallVectorBase<const_slang::syntax::SyntaxNode_*>::begin
                        ((SmallVectorBase<const_slang::syntax::SyntaxNode_*> *)this);
    ctx = (EVP_PKEY_CTX *)
          SmallVectorBase<const_slang::syntax::SyntaxNode_*>::end
                    ((SmallVectorBase<const_slang::syntax::SyntaxNode_*> *)this);
    std::uninitialized_move<slang::syntax::SyntaxNode_const**,slang::syntax::SyntaxNode_const**>
              (ppSVar3,(SyntaxNode **)ctx,__result);
  }
  else {
    ppSVar3 = SmallVectorBase<const_slang::syntax::SyntaxNode_*>::begin
                        ((SmallVectorBase<const_slang::syntax::SyntaxNode_*> *)this);
    std::uninitialized_move<slang::syntax::SyntaxNode_const**,slang::syntax::SyntaxNode_const**>
              (ppSVar3,pos,__result);
    ctx = (EVP_PKEY_CTX *)
          SmallVectorBase<const_slang::syntax::SyntaxNode_*>::end
                    ((SmallVectorBase<const_slang::syntax::SyntaxNode_*> *)this);
    std::uninitialized_move<slang::syntax::SyntaxNode_const**,slang::syntax::SyntaxNode_const**>
              (pos,(SyntaxNode **)ctx,ppSVar4 + 1);
  }
  SmallVectorBase<const_slang::syntax::SyntaxNode_*>::cleanup
            ((SmallVectorBase<const_slang::syntax::SyntaxNode_*> *)this,ctx);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(size_type *)(this + 0x10) = capacity;
  *(SyntaxNode ***)this = __result;
  return ppSVar4;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}